

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

void boost::filesystem::detail::directory_iterator_increment(directory_iterator *it,error_code *ec)

{
  element_type *peVar1;
  DIR *__dirp;
  undefined4 uVar2;
  undefined4 uVar3;
  char *pcVar4;
  uint uVar5;
  uint *puVar6;
  long lVar7;
  dirent64 *pdVar8;
  undefined4 *puVar9;
  error_category *peVar10;
  filesystem_error *this;
  dirent64 *this_00;
  dirent64 *__entry;
  error_code eVar11;
  path error_path;
  string_type filename;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  directory_iterator *local_a0;
  undefined1 local_98 [32];
  char *local_78;
  char *local_70;
  char local_68;
  undefined7 uStack_67;
  string local_58;
  
  peVar1 = (it->m_imp).px;
  local_a0 = it;
  if (peVar1 == (element_type *)0x0) {
    __assert_fail("(it.m_imp.get())&&(\"attempt to increment end iterator\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x8f5,
                  "void boost::filesystem::detail::directory_iterator_increment(directory_iterator &, system::error_code *)"
                 );
  }
  if (peVar1->handle == (void *)0x0) {
    __assert_fail("(it.m_imp->handle != 0)&&(\"internal program error\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x8f6,
                  "void boost::filesystem::detail::directory_iterator_increment(directory_iterator &, system::error_code *)"
                 );
  }
  local_78 = &local_68;
  local_70 = (char *)0x0;
  local_68 = '\0';
  local_ac = 0xffff;
  local_b0 = 0xffff;
  system::system_category();
  this_00 = (dirent64 *)(local_a0->m_imp).px;
  if (this_00 == (dirent64 *)0x0) {
LAB_0010e055:
    __assert_fail("px != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/boost/smart_ptr/shared_ptr.hpp"
                  ,0x2b5,
                  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->() const [T = boost::filesystem::detail::dir_itr_imp]"
                 );
  }
  __entry = *(dirent64 **)(this_00->d_name + 0x25);
  if (__entry != (dirent64 *)0x0) {
    local_a8 = 0;
    puVar6 = (uint *)__errno_location();
    local_b4 = 0;
    do {
      __dirp = *(DIR **)(this_00->d_name + 0x1d);
      *puVar6 = 0;
      lVar7 = sysconf(0x44);
      if (lVar7 < 0) {
        local_98._0_8_ = (dirent64 *)0x0;
        pdVar8 = readdir64(__dirp);
        if (pdVar8 == (dirent64 *)0x0) {
          uVar5 = *puVar6;
          goto LAB_0010ddaa;
        }
        strcpy(__entry->d_name,pdVar8->d_name);
        local_98._0_8_ = __entry;
LAB_0010ddf0:
        pcVar4 = local_70;
        strlen(__entry->d_name);
        std::__cxx11::string::_M_replace((ulong)&local_78,0,pcVar4,(ulong)__entry->d_name);
        switch(__entry->d_type >> 1 | __entry->d_type << 7) {
        default:
          local_a8 = 0;
          local_b4 = 0;
          break;
        case '\x02':
          local_a8 = 3;
          local_b4 = 3;
          break;
        case '\x04':
          local_a8 = 2;
          local_b4 = 2;
          break;
        case '\x05':
          local_ac = 0xffff;
          local_b4 = 0;
          local_a8 = 4;
          puVar9 = &local_b0;
          goto LAB_0010dea4;
        }
        local_b0 = 0xffff;
        puVar9 = &local_ac;
LAB_0010dea4:
        *puVar9 = 0xffff;
        uVar5 = (anonymous_namespace)::ok;
      }
      else {
        uVar5 = readdir64_r(__dirp,__entry,(dirent64 **)local_98);
LAB_0010ddaa:
        if (uVar5 == 0) {
          if ((dirent64 *)local_98._0_8_ != (dirent64 *)0x0) goto LAB_0010ddf0;
          eVar11 = dir_itr_close((void **)(this_00->d_name + 0x1d),(void **)(this_00->d_name + 0x25)
                                );
          uVar5 = eVar11.m_val;
        }
        else {
          uVar5 = *puVar6;
          system::system_category();
        }
      }
      if (uVar5 != 0) {
        peVar1 = (local_a0->m_imp).px;
        if (peVar1 != (element_type *)0x0) {
          path::parent_path((path *)local_98,(path *)peVar1);
          local_58._M_dataplus._M_p = (pointer)(local_a0->m_imp).px;
          local_58._M_string_length = (size_type)(local_a0->m_imp).pn.pi_;
          (local_a0->m_imp).px = (element_type *)0x0;
          (local_a0->m_imp).pn.pi_ = (sp_counted_base *)0x0;
          boost::detail::shared_count::~shared_count((shared_count *)&local_58._M_string_length);
          if (ec == (error_code *)0x0) {
            this = (filesystem_error *)__cxa_allocate_exception(0x50);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"boost::filesystem::directory_iterator::operator++","");
            uVar5 = *puVar6;
            peVar10 = system::system_category();
            eVar11._4_4_ = 0;
            eVar11.m_val = uVar5;
            eVar11.m_cat = peVar10;
            filesystem_error::filesystem_error(this,&local_58,(path *)local_98,eVar11);
            __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
          }
          uVar5 = *puVar6;
          peVar10 = system::system_category();
          ec->m_val = uVar5;
          ec->m_cat = peVar10;
          if ((dirent64 *)local_98._0_8_ == (dirent64 *)(local_98 + 0x10)) goto LAB_0010e027;
LAB_0010dff8:
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
LAB_0010e027:
          if (local_78 != &local_68) {
            operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
          }
          return;
        }
        goto LAB_0010e055;
      }
      if (ec != (error_code *)0x0) {
        ec->m_val = 0;
        peVar10 = system::system_category();
        ec->m_cat = peVar10;
      }
      this_00 = (dirent64 *)(local_a0->m_imp).px;
      if (this_00 == (dirent64 *)0x0) goto LAB_0010e055;
      if (*(long *)(this_00->d_name + 0x1d) == 0) {
        local_98._8_8_ = (local_a0->m_imp).pn.pi_;
        (local_a0->m_imp).px = (element_type *)0x0;
        (local_a0->m_imp).pn.pi_ = (sp_counted_base *)0x0;
        local_98._0_8_ = this_00;
        boost::detail::shared_count::~shared_count((shared_count *)(local_98 + 8));
        goto LAB_0010e027;
      }
      if ((*local_78 != '.') ||
         ((local_70 != (char *)0x1 && ((local_70 != (char *)0x2 || (local_78[1] != '.')))))) {
        local_98._0_8_ = (dirent64 *)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,local_78,local_70 + (long)local_78);
        uVar3 = local_ac;
        uVar2 = local_b0;
        path::remove_filename((path *)this_00);
        path::operator/=((path *)this_00,(path *)local_98);
        *(undefined4 *)(this_00->d_name + 0xd) = local_b4;
        *(undefined4 *)(this_00->d_name + 0x11) = uVar3;
        *(int *)(this_00->d_name + 0x15) = (int)local_a8;
        *(undefined4 *)(this_00->d_name + 0x19) = uVar2;
        if ((dirent64 *)local_98._0_8_ == (dirent64 *)(local_98 + 0x10)) goto LAB_0010e027;
        goto LAB_0010dff8;
      }
      __entry = *(dirent64 **)(this_00->d_name + 0x25);
    } while (__entry != (dirent64 *)0x0);
  }
  __assert_fail("buffer != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                ,0x825,
                "error_code (anonymous namespace)::dir_itr_increment(void *&, void *&, string &, fs::file_status &, fs::file_status &)"
               );
}

Assistant:

void directory_iterator_increment(directory_iterator& it,
    system::error_code* ec)
  {
    BOOST_ASSERT_MSG(it.m_imp.get(), "attempt to increment end iterator");
    BOOST_ASSERT_MSG(it.m_imp->handle != 0, "internal program error");
    
    path::string_type filename;
    file_status file_stat, symlink_file_stat;
    system::error_code temp_ec;

    for (;;)
    {
      temp_ec = dir_itr_increment(it.m_imp->handle,
#       if defined(BOOST_POSIX_API)
        it.m_imp->buffer,
#       endif
        filename, file_stat, symlink_file_stat);

      if (temp_ec)  // happens if filesystem is corrupt, such as on a damaged optical disc
      {
        path error_path(it.m_imp->dir_entry.path().parent_path());  // fix ticket #5900
        it.m_imp.reset();
        if (ec == 0)
          BOOST_FILESYSTEM_THROW(
            filesystem_error("boost::filesystem::directory_iterator::operator++",
              error_path,
              error_code(BOOST_ERRNO, system_category())));
        ec->assign(BOOST_ERRNO, system_category());
        return;
      }
      else if (ec != 0) ec->clear();

      if (it.m_imp->handle == 0)  // eof, make end
      {
        it.m_imp.reset();
        return;
      }

      if (!(filename[0] == dot // !(dot or dot-dot)
        && (filename.size()== 1
          || (filename[1] == dot
            && filename.size()== 2))))
      {
        it.m_imp->dir_entry.replace_filename(
          filename, file_stat, symlink_file_stat);
        return;
      }
    }
  }